

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O2

xxh_u64 XXH64_finalize(xxh_u64 h64,xxh_u8 *ptr,size_t len,XXH_alignment align)

{
  long lVar1;
  xxh_u64 xVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint *puVar6;
  ulong uVar7;
  long *plVar8;
  
  uVar7 = (ulong)((uint)len & 0x1f);
  uVar4 = (ulong)((uint)len & 0x18);
  uVar3 = uVar7 - uVar4;
  plVar8 = (long *)ptr;
  for (; 7 < uVar7; uVar7 = uVar7 - 8) {
    lVar1 = *plVar8;
    plVar8 = plVar8 + 1;
    uVar5 = (lVar1 * -0x6c158a5880000000 | (ulong)(lVar1 * -0x3d4d51c2d82b14b1) >> 0x21) *
            -0x61c8864e7a143579 ^ h64;
    h64 = (uVar5 << 0x1b | uVar5 >> 0x25) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
  }
  puVar6 = (uint *)(ptr + uVar4);
  if (3 < uVar3) {
    uVar4 = (ulong)*puVar6 * -0x61c8864e7a143579 ^ h64;
    puVar6 = puVar6 + 1;
    h64 = (uVar4 << 0x17 | uVar4 >> 0x29) * -0x3d4d51c2d82b14b1 + 0x165667b19e3779f9;
    uVar3 = uVar3 - 4;
  }
  for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    uVar7 = (ulong)*(byte *)((long)puVar6 + uVar4) * 0x27d4eb2f165667c5 ^ h64;
    h64 = (uVar7 << 0xb | uVar7 >> 0x35) * -0x61c8864e7a143579;
  }
  xVar2 = XXH64_avalanche(h64);
  return xVar2;
}

Assistant:

static xxh_u64
XXH64_finalize(xxh_u64 h64, const xxh_u8* ptr, size_t len, XXH_alignment align)
{
    len &= 31;
    while (len >= 8) {
        xxh_u64 const k1 = XXH64_round(0, XXH_get64bits(ptr));
        ptr += 8;
        h64 ^= k1;
        h64  = XXH_rotl64(h64,27) * XXH_PRIME64_1 + XXH_PRIME64_4;
        len -= 8;
    }
    if (len >= 4) {
        h64 ^= (xxh_u64)(XXH_get32bits(ptr)) * XXH_PRIME64_1;
        ptr += 4;
        h64 = XXH_rotl64(h64, 23) * XXH_PRIME64_2 + XXH_PRIME64_3;
        len -= 4;
    }
    while (len > 0) {
        h64 ^= (*ptr++) * XXH_PRIME64_5;
        h64 = XXH_rotl64(h64, 11) * XXH_PRIME64_1;
        --len;
    }
    return  XXH64_avalanche(h64);
}